

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

ClockingSkew __thiscall
slang::ast::ClockingBlockSymbol::getDefaultInputSkew(ClockingBlockSymbol *this)

{
  Scope *pSVar1;
  LookupLocation LVar2;
  ClockingSkew CVar3;
  Scope *local_48;
  uint32_t local_40;
  SyntaxNode *local_38;
  Token TStack_30;
  TimingControlSyntax *pTStack_20;
  undefined8 local_18;
  
  if ((this->defaultInputSkew).super__Optional_base<slang::ast::ClockingSkew,_true,_true>._M_payload
      .super__Optional_payload_base<slang::ast::ClockingSkew>._M_engaged == true) {
    CVar3._4_4_ = 0;
    CVar3.edge = (this->defaultInputSkew).super__Optional_base<slang::ast::ClockingSkew,_true,_true>
                 ._M_payload.super__Optional_payload_base<slang::ast::ClockingSkew>._M_payload.
                 _M_value.edge;
    CVar3.delay = (this->defaultInputSkew).
                  super__Optional_base<slang::ast::ClockingSkew,_true,_true>._M_payload.
                  super__Optional_payload_base<slang::ast::ClockingSkew>._M_payload._M_value.delay;
  }
  else if (this->inputSkewSyntax == (ClockingSkewSyntax *)0x0) {
    *(undefined8 *)
     &(this->defaultInputSkew).super__Optional_base<slang::ast::ClockingSkew,_true,_true>._M_payload
      .super__Optional_payload_base<slang::ast::ClockingSkew>._M_payload = 0;
    (this->defaultInputSkew).super__Optional_base<slang::ast::ClockingSkew,_true,_true>._M_payload.
    super__Optional_payload_base<slang::ast::ClockingSkew>._M_payload._M_value.delay =
         (TimingControl *)0x0;
    (this->defaultInputSkew).super__Optional_base<slang::ast::ClockingSkew,_true,_true>._M_payload.
    super__Optional_payload_base<slang::ast::ClockingSkew>._M_engaged = true;
    CVar3 = (ClockingSkew)ZEXT816(0);
  }
  else {
    pSVar1 = (this->super_Symbol).parentScope;
    LVar2 = LookupLocation::before(&this->super_Symbol);
    local_40 = LVar2.index;
    local_38 = (SyntaxNode *)0x0;
    TStack_30.kind = Unknown;
    TStack_30._2_1_ = 0;
    TStack_30.numFlags.raw = '\0';
    TStack_30.rawLen = 0;
    TStack_30.info = (Info *)0x0;
    pTStack_20 = (TimingControlSyntax *)0x0;
    local_18 = 0;
    local_48 = pSVar1;
    CVar3 = ClockingSkew::fromSyntax
                      ((ClockingSkew *)this->inputSkewSyntax,(ClockingSkewSyntax *)&local_48,
                       LVar2._8_8_);
    (this->defaultInputSkew).super__Optional_base<slang::ast::ClockingSkew,_true,_true>._M_payload.
    super__Optional_payload_base<slang::ast::ClockingSkew>._M_payload._M_value.edge = CVar3.edge;
    (this->defaultInputSkew).super__Optional_base<slang::ast::ClockingSkew,_true,_true>._M_payload.
    super__Optional_payload_base<slang::ast::ClockingSkew>._M_payload._M_value.delay = CVar3.delay;
    if ((this->defaultInputSkew).super__Optional_base<slang::ast::ClockingSkew,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::ClockingSkew>._M_engaged == false) {
      (this->defaultInputSkew).super__Optional_base<slang::ast::ClockingSkew,_true,_true>._M_payload
      .super__Optional_payload_base<slang::ast::ClockingSkew>._M_engaged = true;
    }
  }
  return CVar3;
}

Assistant:

ClockingSkew ClockingBlockSymbol::getDefaultInputSkew() const {
    if (!defaultInputSkew) {
        if (inputSkewSyntax) {
            auto scope = getParentScope();
            SLANG_ASSERT(scope);

            ASTContext context(*scope, LookupLocation::before(*this));
            defaultInputSkew = ClockingSkew::fromSyntax(*inputSkewSyntax, context);
        }
        else {
            defaultInputSkew.emplace();
        }
    }
    return *defaultInputSkew;
}